

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O1

char * ngx_http_set_complex_value_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_uint_t nVar1;
  char *pcVar2;
  ngx_int_t nVar3;
  undefined1 auStack_48 [8];
  ngx_http_compile_complex_value_t ccv;
  
  nVar1 = cmd->offset;
  if (*(long *)((long)conf + nVar1) == 0) {
    ccv.value = (ngx_str_t *)ngx_palloc(cf->pool,0x28);
    *(ngx_str_t **)((long)conf + nVar1) = ccv.value;
    if (ccv.value == (ngx_str_t *)0x0) {
      pcVar2 = (char *)0xffffffffffffffff;
    }
    else {
      ccv.complex_value = (ngx_http_complex_value_t *)0x0;
      ccv.cf = (ngx_conf_t *)((long)cf->args->elts + 0x10);
      auStack_48 = (undefined1  [8])cf;
      nVar3 = ngx_http_compile_complex_value((ngx_http_compile_complex_value_t *)auStack_48);
      pcVar2 = (char *)-(ulong)(nVar3 != 0);
    }
  }
  else {
    pcVar2 = "is duplicate";
  }
  return pcVar2;
}

Assistant:

char *
ngx_http_set_complex_value_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ngx_str_t                          *value;
    ngx_http_complex_value_t          **cv;
    ngx_http_compile_complex_value_t    ccv;

    cv = (ngx_http_complex_value_t **) (p + cmd->offset);

    if (*cv != NULL) {
        return "is duplicate";
    }

    *cv = ngx_palloc(cf->pool, sizeof(ngx_http_complex_value_t));
    if (*cv == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    ngx_memzero(&ccv, sizeof(ngx_http_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = *cv;

    if (ngx_http_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}